

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O1

void __thiscall
capnp::TwoPartyClient::TwoPartyClient
          (TwoPartyClient *this,AsyncIoStream *connection,Client *bootstrapInterface,Side side)

{
  undefined8 uVar1;
  MonotonicClock *clock;
  ReaderOptions receiveOptions;
  Maybe<capnp::Capability::Client> local_38;
  
  clock = kj::systemCoarseMonotonicClock();
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&this->network,connection,side,receiveOptions,clock);
  local_38.ptr.isSet = true;
  (*((bootstrapInterface->hook).ptr)->_vptr_ClientHook[4])();
  RpcSystem<capnp::rpc::twoparty::VatId>::
  RpcSystem<capnp::rpc::twoparty::ThirdPartyCompletion,capnp::rpc::twoparty::ThirdPartyToAwait,capnp::rpc::twoparty::ThirdPartyToContact,capnp::rpc::twoparty::JoinResult>
            (&this->rpcSystem,
             (VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ThirdPartyCompletion,_capnp::rpc::twoparty::ThirdPartyToAwait,_capnp::rpc::twoparty::ThirdPartyToContact,_capnp::rpc::twoparty::JoinResult>
              *)this,&local_38);
  uVar1 = local_38.ptr.field_1.value.hook.ptr;
  if ((local_38.ptr.isSet == true) && (local_38.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)) {
    local_38.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    (**(local_38.ptr.field_1.value.hook.disposer)->_vptr_Disposer)
              (local_38.ptr.field_1.value.hook.disposer,
               (_func_int *)
               ((long)&((ClientHook *)uVar1)->_vptr_ClientHook +
               (long)((ClientHook *)uVar1)->_vptr_ClientHook[-2]));
  }
  return;
}

Assistant:

TwoPartyClient::TwoPartyClient(kj::AsyncIoStream& connection,
                               Capability::Client bootstrapInterface,
                               rpc::twoparty::Side side)
    : network(connection, side),
      rpcSystem(network, bootstrapInterface) {}